

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O0

void __thiscall
amrex::DeriveList::add
          (DeriveList *this,string *name,IndexType result_type,int nvar_der,DeriveBoxMap box_map)

{
  IndexType in_EDX;
  DeriveBoxMap in_RDI;
  value_type *__x;
  string *in_stack_ffffffffffffff20;
  DeriveRec *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  value_type local_c8;
  
  __x = &local_c8;
  DeriveRec::DeriveRec
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_EDX,(int)((ulong)__x >> 0x20),
             in_RDI);
  std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::push_back
            ((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)in_stack_ffffffffffffff20,
             __x);
  DeriveRec::~DeriveRec((DeriveRec *)CONCAT44(in_EDX.itype,in_stack_ffffffffffffff30));
  return;
}

Assistant:

void
DeriveList::add (const std::string&      name,
                 IndexType               result_type,
                 int                     nvar_der,
                 DeriveRec::DeriveBoxMap box_map)
{
    lst.push_back(DeriveRec(name,result_type,nvar_der,box_map));
}